

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::BasicSharedVarCase::iterate(BasicSharedVarCase *this)

{
  int iVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  ContextType type;
  GLSLVersion version;
  deUint32 dVar6;
  deUint32 dVar7;
  int iVar8;
  RenderContext *pRVar9;
  undefined4 extraout_var;
  int *piVar10;
  char *pcVar11;
  ostream *poVar12;
  ProgramSources *sources;
  TestLog *pTVar13;
  TestError *pTVar14;
  MessageBuilder *pMVar15;
  void *pvVar16;
  int iVar17;
  IVec3 *pIVar18;
  int local_65c;
  string local_658;
  allocator<char> local_631;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  int local_5cc;
  int local_5c8;
  deUint32 ref;
  deUint32 res;
  int globalOffs;
  int localOffs;
  int groupNdx;
  BufferMemMap bufMap;
  InterfaceVariableInfo valueInfo;
  deUint32 valueIndex;
  int blockSize_1;
  deUint32 blockIndex_1;
  int blockSize;
  deUint32 blockIndex;
  string local_3b8;
  ShaderSource local_398;
  ProgramSources local_370;
  undefined1 local_2a0 [8];
  ShaderProgram program;
  ostringstream src;
  GLSLVersion glslVersion;
  int numValues;
  int workGroupCount;
  int workGroupSize;
  Buffer outputBuffer;
  Functions *gl;
  BasicSharedVarCase *this_local;
  
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  outputBuffer.super_ObjectWrapper.m_object = (*pRVar9->_vptr_RenderContext[3])();
  outputBuffer.super_ObjectWrapper._20_4_ = extraout_var;
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&workGroupCount,pRVar9);
  pIVar18 = &this->m_localSize;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,0);
  iVar17 = *piVar10;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,1);
  iVar8 = *piVar10;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,2);
  iVar5 = iVar17 * iVar8 * *piVar10;
  pIVar18 = &this->m_workSize;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,0);
  iVar17 = *piVar10;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,1);
  iVar8 = *piVar10;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,2);
  iVar17 = iVar17 * iVar8 * *piVar10;
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar9->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program.m_program.m_info.linkTimeUs);
  pcVar11 = glu::getGLSLVersionDeclaration(version);
  poVar12 = std::operator<<((ostream *)&program.m_program.m_info.linkTimeUs,pcVar11);
  poVar12 = std::operator<<(poVar12,"\n");
  poVar12 = std::operator<<(poVar12,"layout (local_size_x = ");
  piVar10 = tcu::Vector<int,_3>::operator[](&this->m_localSize,0);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar10);
  poVar12 = std::operator<<(poVar12,", local_size_y = ");
  piVar10 = tcu::Vector<int,_3>::operator[](&this->m_localSize,1);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar10);
  poVar12 = std::operator<<(poVar12,", local_size_z = ");
  piVar10 = tcu::Vector<int,_3>::operator[](&this->m_localSize,2);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,*piVar10);
  poVar12 = std::operator<<(poVar12,") in;\n");
  poVar12 = std::operator<<(poVar12,"layout(binding = 0) buffer Output {\n");
  poVar12 = std::operator<<(poVar12,"    uint values[");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5 * iVar17);
  poVar12 = std::operator<<(poVar12,"];\n");
  poVar12 = std::operator<<(poVar12,"} sb_out;\n\n");
  poVar12 = std::operator<<(poVar12,"shared uint offsets[");
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar5);
  poVar12 = std::operator<<(poVar12,"];\n\n");
  poVar12 = std::operator<<(poVar12,"void main (void) {\n");
  poVar12 = std::operator<<(poVar12,
                            "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                           );
  poVar12 = std::operator<<(poVar12,
                            "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                           );
  poVar12 = std::operator<<(poVar12,"    uint globalOffs = localSize*globalNdx;\n");
  poVar12 = std::operator<<(poVar12,
                            "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
                           );
  poVar12 = std::operator<<(poVar12,"\n");
  poVar12 = std::operator<<(poVar12,
                            "    offsets[localSize-localOffs-1u] = globalOffs + localOffs*localOffs;\n"
                           );
  poVar12 = std::operator<<(poVar12,"    barrier();\n");
  poVar12 = std::operator<<(poVar12,
                            "    sb_out.values[globalOffs + localOffs] = offsets[localOffs];\n");
  std::operator<<(poVar12,"}\n");
  pRVar9 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_370);
  std::__cxx11::ostringstream::str();
  glu::ShaderSource::ShaderSource(&local_398,SHADERTYPE_COMPUTE,&local_3b8);
  sources = glu::ProgramSources::operator<<(&local_370,&local_398);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_2a0,pRVar9,sources);
  glu::ShaderSource::~ShaderSource(&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  glu::ProgramSources::~ProgramSources(&local_370);
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  glu::operator<<(pTVar13,(ShaderProgram *)local_2a0);
  bVar4 = glu::ShaderProgram::isOk((ShaderProgram *)local_2a0);
  if (!bVar4) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x35c);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&blockSize,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&blockSize,(char (*) [14])"Work groups: ");
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&this->m_workSize);
  tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&blockSize);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x1680);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  (*pcVar2)(dVar6);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x9a8);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  dVar6 = (*pcVar2)(dVar6,0x92e6,"Output");
  uVar3 = outputBuffer.super_ObjectWrapper._16_8_;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  iVar8 = glu::getProgramResourceInt((Functions *)uVar3,dVar7,0x92e6,dVar6,0x9303);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x40);
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&workGroupCount);
  (*pcVar2)(0x90d2,dVar6);
  (**(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x150))(0x90d2,(long)iVar8,0,0x88e1);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x48);
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)&workGroupCount);
  (*pcVar2)(0x90d2,0,dVar6);
  dVar6 = (**(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x800))();
  glu::checkError(dVar6,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x36a);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x528);
  pIVar18 = &this->m_workSize;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,0);
  iVar8 = *piVar10;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,1);
  iVar1 = *piVar10;
  piVar10 = tcu::Vector<int,_3>::operator[](pIVar18,2);
  (*pcVar2)(iVar8,iVar1,*piVar10);
  dVar6 = (**(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x800))();
  glu::checkError(dVar6,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x36f);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x9a8);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  dVar6 = (*pcVar2)(dVar6,0x92e6,"Output");
  uVar3 = outputBuffer.super_ObjectWrapper._16_8_;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  iVar8 = glu::getProgramResourceInt((Functions *)uVar3,dVar7,0x92e6,dVar6,0x9303);
  pcVar2 = *(code **)(outputBuffer.super_ObjectWrapper._16_8_ + 0x9a8);
  dVar6 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  dVar6 = (*pcVar2)(dVar6,0x92e5,"Output.values");
  uVar3 = outputBuffer.super_ObjectWrapper._16_8_;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_2a0);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap.m_ptr,(Functions *)uVar3,dVar7,0x92e5,dVar6);
  BufferMemMap::BufferMemMap
            ((BufferMemMap *)&localOffs,(Functions *)outputBuffer.super_ObjectWrapper._16_8_,0x90d2,
             0,iVar8,1);
  globalOffs = 0;
  do {
    if (iVar17 <= globalOffs) {
      BufferMemMap::~BufferMemMap((BufferMemMap *)&localOffs);
      glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap.m_ptr);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_2a0);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&program.m_program.m_info.linkTimeUs);
      glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)1> *)&workGroupCount);
      return STOP;
    }
    for (res = 0; (int)res < iVar5; res = res + 1) {
      ref = globalOffs * iVar5;
      pvVar16 = BufferMemMap::getPtr((BufferMemMap *)&localOffs);
      local_5c8 = *(int *)((long)pvVar16 +
                          (long)(int)(valueInfo.arraySize * (ref + res)) + (ulong)valueInfo.type);
      local_5cc = ref + ((iVar5 - res) + -1) * ((iVar5 - res) + -1);
      if (local_5c8 != local_5cc) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_630,"Comparison failed for Output.values[",&local_631);
        local_65c = ref + res;
        de::toString<int>(&local_658,&local_65c);
        std::operator+(&local_610,&local_630,&local_658);
        std::operator+(&local_5f0,&local_610,"]");
        tcu::TestError::TestError(pTVar14,&local_5f0);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    globalOffs = globalOffs + 1;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "shared uint offsets[" << workGroupSize << "];\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
			<< "\n"
			<< "    offsets[localSize-localOffs-1u] = globalOffs + localOffs*localOffs;\n"
			<< "    barrier();\n"
			<< "    sb_out.values[globalOffs + localOffs] = offsets[localOffs];\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			for (int groupNdx = 0; groupNdx < workGroupCount; groupNdx++)
			{
				for (int localOffs = 0; localOffs < workGroupSize; localOffs++)
				{
					const int		globalOffs	= groupNdx*workGroupSize;
					const deUint32	res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*(globalOffs + localOffs)));
					const deUint32	ref			= (deUint32)(globalOffs + (workGroupSize-localOffs-1)*(workGroupSize-localOffs-1));

					if (res != ref)
						throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(globalOffs + localOffs) + "]");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}